

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlenderScene.cpp
# Opt level: O0

void __thiscall
Assimp::Blender::Structure::Convert<Assimp::Blender::Camera>
          (Structure *this,Camera *dest,FileDatabase *db)

{
  element_type *this_00;
  int local_24;
  FileDatabase *pFStack_20;
  int temp;
  FileDatabase *db_local;
  Camera *dest_local;
  Structure *this_local;
  
  pFStack_20 = db;
  db_local = (FileDatabase *)dest;
  dest_local = (Camera *)this;
  ReadField<2,Assimp::Blender::ID>(this,&dest->id,"id",db);
  local_24 = 0;
  ReadField<1,int>(this,&local_24,"type",pFStack_20);
  *(int *)&db_local[4].reader.
           super___shared_ptr<Assimp::StreamReader<true,_true>,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi = local_24;
  ReadField<1,int>(this,&local_24,"flag",pFStack_20);
  *(int *)((long)&db_local[4].reader.
                  super___shared_ptr<Assimp::StreamReader<true,_true>,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi + 4) = local_24;
  ReadField<1,float>(this,(float *)&db_local[4].entries,"lens",pFStack_20);
  ReadField<1,float>(this,(float *)((long)&db_local[4].entries.
                                           super_vector<Assimp::Blender::FileBlockHead,_std::allocator<Assimp::Blender::FileBlockHead>_>
                                           .
                                           super__Vector_base<Assimp::Blender::FileBlockHead,_std::allocator<Assimp::Blender::FileBlockHead>_>
                                           ._M_impl.super__Vector_impl_data._M_start + 4),"sensor_x"
                     ,pFStack_20);
  ReadField<1,float>(this,(float *)&db_local[4].entries.
                                    super_vector<Assimp::Blender::FileBlockHead,_std::allocator<Assimp::Blender::FileBlockHead>_>
                                    .
                                    super__Vector_base<Assimp::Blender::FileBlockHead,_std::allocator<Assimp::Blender::FileBlockHead>_>
                                    ._M_impl.super__Vector_impl_data._M_finish,"clipsta",pFStack_20)
  ;
  ReadField<1,float>(this,(float *)((long)&db_local[4].entries.
                                           super_vector<Assimp::Blender::FileBlockHead,_std::allocator<Assimp::Blender::FileBlockHead>_>
                                           .
                                           super__Vector_base<Assimp::Blender::FileBlockHead,_std::allocator<Assimp::Blender::FileBlockHead>_>
                                           ._M_impl.super__Vector_impl_data._M_finish + 4),"clipend"
                     ,pFStack_20);
  this_00 = ::std::
            __shared_ptr_access<Assimp::StreamReader<true,_true>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<Assimp::StreamReader<true,_true>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)&pFStack_20->reader);
  StreamReader<true,_true>::IncPtr(this_00,this->size);
  return;
}

Assistant:

void Structure :: Convert<Camera> (
    Camera& dest,
    const FileDatabase& db
    ) const
{

    ReadField<ErrorPolicy_Fail>(dest.id,"id",db);
    int temp = 0;
    ReadField<ErrorPolicy_Warn>(temp,"type",db);
    dest.type = static_cast<Assimp::Blender::Camera::Type>(temp);
    ReadField<ErrorPolicy_Warn>(temp,"flag",db);
    dest.flag = static_cast<Assimp::Blender::Camera::Type>(temp);
    ReadField<ErrorPolicy_Warn>(dest.lens,"lens",db);
    ReadField<ErrorPolicy_Warn>(dest.sensor_x,"sensor_x",db);
    ReadField<ErrorPolicy_Igno>(dest.clipsta,"clipsta",db);
    ReadField<ErrorPolicy_Igno>(dest.clipend,"clipend",db);

    db.reader->IncPtr(size);
}